

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Vector<Converter::Impl::RawDeclarationVariable> * __thiscall
dxil_spv::Converter::Impl::create_ubo_variable_alias_group
          (Vector<Converter::Impl::RawDeclarationVariable> *__return_storage_ptr__,Impl *this,
          Vector<RawDeclaration> *raw_decls,uint32_t range_size,String *name,uint cbv_size)

{
  pointer *ppRVar1;
  pointer pRVar2;
  iterator __position;
  RawDeclaration *decl;
  pointer raw_decl;
  RawDeclarationVariable local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::reserve(__return_storage_ptr__,
            ((long)(raw_decls->
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(raw_decls->
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  pRVar2 = (raw_decls->
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (raw_decl = (raw_decls->
                  super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                  )._M_impl.super__Vector_impl_data._M_start; raw_decl != pRVar2;
      raw_decl = raw_decl + 1) {
    local_40.declaration.vecsize = raw_decl->vecsize;
    local_40.declaration.type = raw_decl->type;
    local_40.declaration.width = raw_decl->width;
    local_40.var_id = create_ubo_variable(this,raw_decl,range_size,name,cbv_size);
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                (__return_storage_ptr__,__position,&local_40);
    }
    else {
      ((__position._M_current)->declaration).type = local_40.declaration.type;
      ((__position._M_current)->declaration).width = local_40.declaration.width;
      *(ulong *)&((__position._M_current)->declaration).vecsize =
           CONCAT44(local_40.var_id,local_40.declaration.vecsize);
      ppRVar1 = &(__return_storage_ptr__->
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Converter::Impl::RawDeclarationVariable> Converter::Impl::create_ubo_variable_alias_group(
		const Vector<RawDeclaration> &raw_decls,
		uint32_t range_size, const String &name, unsigned cbv_size)
{
	Vector<RawDeclarationVariable> group;
	group.reserve(raw_decls.size());
	for (auto &decl : raw_decls)
		group.push_back({ decl, create_ubo_variable(decl, range_size, name, cbv_size) });
	return group;
}